

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
          *this,char **key)

{
  char *pcVar1;
  long lVar2;
  ushort uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  ulong uVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  undefined1 uVar37;
  bool bVar38;
  ushort uVar39;
  int iVar40;
  uint uVar41;
  size_t sVar42;
  uint64_t uVar43;
  size_t sVar44;
  ulong uVar45;
  ctrl_t *pcVar46;
  PolicyFunctions *pPVar47;
  PolicyFunctions *policy;
  ulong uVar48;
  CommonFields *common;
  uchar *bytes;
  ulong uVar49;
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i match;
  undefined1 auVar53 [16];
  FindInfo target;
  ulong local_a8;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_98;
  _Head_base<0UL,_const_upb::generator::FieldClass_&,_false> local_90;
  PolicyFunctions *local_88;
  char **local_80;
  ulong local_78;
  ulong local_70;
  char **local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
  *local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  pcVar1 = *key;
  sVar42 = strlen(pcVar1);
  uVar43 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,pcVar1,sVar42);
  pPVar47 = *(PolicyFunctions **)this;
  if (((ulong)((long)&pPVar47->slot_size + 1U) & (ulong)pPVar47) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar48 = (uVar43 ^ sVar42) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar48 >> 0x38 | (uVar48 & 0xff000000000000) >> 0x28 | (uVar48 & 0xff0000000000) >> 0x18
            | (uVar48 & 0xff00000000) >> 8 | (uVar48 & 0xff000000) << 8 |
            (uVar48 & 0xff0000) << 0x18 | (uVar48 & 0xff00) << 0x28 | uVar48 << 0x38);
  uVar45 = *(ulong *)(this + 0x10);
  uVar49 = (ulong)common >> 7 ^ uVar45 >> 0xc;
  uVar37 = (undefined1)(uVar48 >> 0x38);
  auVar51 = ZEXT216(CONCAT11(uVar37,uVar37) & 0x7f7f);
  auVar51 = pshuflw(auVar51,auVar51,0);
  uVar50 = auVar51._0_4_;
  auVar51._4_4_ = uVar50;
  auVar51._0_4_ = uVar50;
  auVar51._8_4_ = uVar50;
  auVar51._12_4_ = uVar50;
  local_a8 = 0;
  do {
    uVar49 = uVar49 & (ulong)pPVar47;
    pcVar1 = (char *)(uVar45 + uVar49);
    auVar52[0] = -(auVar51[0] == *pcVar1);
    auVar52[1] = -(auVar51[1] == pcVar1[1]);
    auVar52[2] = -(auVar51[2] == pcVar1[2]);
    auVar52[3] = -(auVar51[3] == pcVar1[3]);
    auVar52[4] = -(auVar51[4] == pcVar1[4]);
    auVar52[5] = -(auVar51[5] == pcVar1[5]);
    auVar52[6] = -(auVar51[6] == pcVar1[6]);
    auVar52[7] = -(auVar51[7] == pcVar1[7]);
    auVar52[8] = -(auVar51[8] == pcVar1[8]);
    auVar52[9] = -(auVar51[9] == pcVar1[9]);
    auVar52[10] = -(auVar51[10] == pcVar1[10]);
    auVar52[0xb] = -(auVar51[0xb] == pcVar1[0xb]);
    auVar52[0xc] = -(auVar51[0xc] == pcVar1[0xc]);
    auVar52[0xd] = -(auVar51[0xd] == pcVar1[0xd]);
    auVar52[0xe] = -(auVar51[0xe] == pcVar1[0xe]);
    auVar52[0xf] = -(auVar51[0xf] == pcVar1[0xf]);
    uVar39 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    uVar20 = (ulong)uVar39;
    cVar21 = *pcVar1;
    cVar22 = pcVar1[1];
    cVar23 = pcVar1[2];
    cVar24 = pcVar1[3];
    cVar25 = pcVar1[4];
    cVar26 = pcVar1[5];
    cVar27 = pcVar1[6];
    cVar28 = pcVar1[7];
    cVar29 = pcVar1[8];
    cVar30 = pcVar1[9];
    cVar31 = pcVar1[10];
    cVar32 = pcVar1[0xb];
    cVar33 = pcVar1[0xc];
    cVar34 = pcVar1[0xd];
    cVar35 = pcVar1[0xe];
    cVar36 = pcVar1[0xf];
    uVar48 = local_70;
    cVar4 = local_58;
    cVar5 = cStack_57;
    cVar6 = cStack_56;
    cVar7 = cStack_55;
    cVar8 = cStack_54;
    cVar9 = cStack_53;
    cVar10 = cStack_52;
    cVar11 = cStack_51;
    cVar12 = cStack_50;
    cVar13 = cStack_4f;
    cVar14 = cStack_4e;
    cVar15 = cStack_4d;
    cVar16 = cStack_4c;
    cVar17 = cStack_4b;
    cVar18 = cStack_4a;
    cVar19 = cStack_49;
    while (cStack_49 = cVar36, cStack_4a = cVar35, cStack_4b = cVar34, cStack_4c = cVar33,
          cStack_4d = cVar32, cStack_4e = cVar31, cStack_4f = cVar30, cStack_50 = cVar29,
          cStack_51 = cVar28, cStack_52 = cVar27, cStack_53 = cVar26, cStack_54 = cVar25,
          cStack_55 = cVar24, cStack_56 = cVar23, cStack_57 = cVar22, local_58 = cVar21,
          local_70 = uVar20, uVar39 != 0) {
      uVar41 = 0;
      if ((uint)local_70 != 0) {
        for (; ((uint)local_70 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      sVar44 = uVar41 + uVar49 & (ulong)pPVar47;
      local_98._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (*(long *)(this + 0x18) + sVar44 * 0x28);
      local_90._M_head_impl = (FieldClass *)(*(long *)(this + 0x18) + 0x20 + sVar44 * 0x28);
      local_88 = pPVar47;
      local_80 = key;
      local_78 = uVar45;
      local_68 = key;
      local_60 = this;
      local_48 = auVar51;
      bVar38 = EqualElement<char_const*>::operator()
                         ((EqualElement<char_const*> *)&local_68,local_98._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&local_98,(tuple<const_upb::generator::FieldClass_&> *)&local_90);
      if (bVar38) {
        if (*(long *)(this + 0x10) == 0) goto LAB_002760f2;
        pcVar46 = (ctrl_t *)(*(long *)(this + 0x10) + sVar44);
        bVar38 = false;
        goto LAB_002760a7;
      }
      iVar40 = (int)local_70 + -1;
      uVar39 = (ushort)iVar40 & (ushort)local_70;
      key = local_80;
      uVar45 = local_78;
      pPVar47 = local_88;
      uVar20 = (ulong)CONCAT22((short)((uint)iVar40 >> 0x10),uVar39);
      auVar51 = local_48;
      cVar21 = local_58;
      cVar22 = cStack_57;
      cVar23 = cStack_56;
      cVar24 = cStack_55;
      cVar25 = cStack_54;
      cVar26 = cStack_53;
      cVar27 = cStack_52;
      cVar28 = cStack_51;
      cVar29 = cStack_50;
      cVar30 = cStack_4f;
      cVar31 = cStack_4e;
      cVar32 = cStack_4d;
      cVar33 = cStack_4c;
      cVar34 = cStack_4b;
      cVar35 = cStack_4a;
      cVar36 = cStack_49;
      uVar48 = local_70;
      cVar4 = local_58;
      cVar5 = cStack_57;
      cVar6 = cStack_56;
      cVar7 = cStack_55;
      cVar8 = cStack_54;
      cVar9 = cStack_53;
      cVar10 = cStack_52;
      cVar11 = cStack_51;
      cVar12 = cStack_50;
      cVar13 = cStack_4f;
      cVar14 = cStack_4e;
      cVar15 = cStack_4d;
      cVar16 = cStack_4c;
      cVar17 = cStack_4b;
      cVar18 = cStack_4a;
      cVar19 = cStack_49;
    }
    auVar53[0] = -(local_58 == -0x80);
    auVar53[1] = -(cStack_57 == -0x80);
    auVar53[2] = -(cStack_56 == -0x80);
    auVar53[3] = -(cStack_55 == -0x80);
    auVar53[4] = -(cStack_54 == -0x80);
    auVar53[5] = -(cStack_53 == -0x80);
    auVar53[6] = -(cStack_52 == -0x80);
    auVar53[7] = -(cStack_51 == -0x80);
    auVar53[8] = -(cStack_50 == -0x80);
    auVar53[9] = -(cStack_4f == -0x80);
    auVar53[10] = -(cStack_4e == -0x80);
    auVar53[0xb] = -(cStack_4d == -0x80);
    auVar53[0xc] = -(cStack_4c == -0x80);
    auVar53[0xd] = -(cStack_4b == -0x80);
    auVar53[0xe] = -(cStack_4a == -0x80);
    auVar53[0xf] = -(cStack_49 == -0x80);
    uVar39 = (ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe | (ushort)(auVar53[0xf] >> 7) << 0xf;
    local_70 = uVar48;
    local_58 = cVar4;
    cStack_57 = cVar5;
    cStack_56 = cVar6;
    cStack_55 = cVar7;
    cStack_54 = cVar8;
    cStack_53 = cVar9;
    cStack_52 = cVar10;
    cStack_51 = cVar11;
    cStack_50 = cVar12;
    cStack_4f = cVar13;
    cStack_4e = cVar14;
    cStack_4d = cVar15;
    cStack_4c = cVar16;
    cStack_4b = cVar17;
    cStack_4a = cVar18;
    cStack_49 = cVar19;
    if (uVar39 != 0) {
      policy = pPVar47;
      bVar38 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar38) {
        uVar3 = 0xf;
        if (uVar39 != 0) {
          for (; uVar39 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar41 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar41 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_a8;
      sVar44 = PrepareInsertNonSoo((container_internal *)this,common,
                                   uVar41 + uVar49 & (ulong)pPVar47,target,policy);
      if (*(long *)(this + 0x10) == 0) {
LAB_002760f2:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>]"
                     );
      }
      pcVar46 = (ctrl_t *)(*(long *)(this + 0x10) + sVar44);
      bVar38 = true;
LAB_002760a7:
      lVar2 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar46;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(sVar44 * 0x28 + lVar2);
      __return_storage_ptr__->second = bVar38;
      return __return_storage_ptr__;
    }
    uVar49 = uVar49 + local_a8 + 0x10;
    local_a8 = local_a8 + 0x10;
    if (*(ulong *)this < local_a8) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>, K = const char *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }